

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

void FIX::socket_init(void)

{
  sigaction sa;
  _union_1457 local_a0;
  sigset_t local_98;
  undefined4 local_18;
  
  local_a0 = (_union_1457)0x1;
  sigemptyset(&local_98);
  local_18 = 0;
  sigaction(0xd,(sigaction *)&local_a0,(sigaction *)0x0);
  return;
}

Assistant:

void socket_init() {
#ifdef _MSC_VER
  WORD version = MAKEWORD(2, 2);
  WSADATA data;
  WSAStartup(version, &data);
#else
  struct sigaction sa;
  sa.sa_handler = SIG_IGN;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(SIGPIPE, &sa, 0);
#endif
}